

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlog.cxx
# Opt level: O2

string * zpsoe::zlog::errno_to_str_abi_cxx11_(void)

{
  zlog *this;
  char *__s;
  int *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator<char> local_99;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this = (zlog *)__errno_location();
  __s = strerror(*(int *)this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_99);
  std::operator+(&local_78,&local_38,"(errno: ");
  int_to_str_abi_cxx11_(&local_98,this,value);
  std::operator+(&local_58,&local_78,&local_98);
  std::operator+(in_RDI,&local_58,")");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  return in_RDI;
}

Assistant:

string errno_to_str() {
#ifdef PLATFORM_WIN32
    string msg_(_strerror(NULL));
    const size_t size_ = msg_.size();

    if (size_) msg_.erase(size_-1);

    return msg_ + "(errno: " + int_to_str(errno) + ")";
#else
    return string(strerror(errno)) + "(errno: " + int_to_str(errno) + ")";
#endif
}